

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpropertyprivate.h
# Opt level: O2

QPropertyBindingPrivate * __thiscall
QtPrivate::QPropertyBindingData::binding(QPropertyBindingData *this)

{
  QPropertyBindingData *pQVar1;
  
  pQVar1 = (QPropertyBindingData *)(this->d_ptr & 0xfffffffffffffffc);
  if ((this->d_ptr & 2) == 0) {
    pQVar1 = this;
  }
  return (QPropertyBindingPrivate *)(pQVar1->d_ptr - 1 & -(ulong)((uint)pQVar1->d_ptr & 1));
}

Assistant:

bool isNotificationDelayed() const { return d_ptr & DelayedNotificationBit; }